

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_loremaster.cpp
# Opt level: O0

int AF_A_LoremasterChain(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *pAVar1;
  bool bVar2;
  bool local_f6;
  bool local_f3;
  TVector3<double> local_f0;
  DVector3 local_d8;
  FName local_bc;
  TVector3<double> local_b8;
  TVector3<double> local_a0;
  DVector3 local_88;
  FName local_6c;
  DVector3 local_68;
  FName local_50;
  FSoundID local_4c;
  void *local_48;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                  ,0x24,"int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_f3 = true;
    if (stateowner != (AActor *)0x0) {
      local_f3 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_f3 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                    ,0x24,
                    "int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                      ,0x24,
                      "int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_f6 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_f6 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_f6 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                      ,0x24,
                      "int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    pAVar1 = stateowner;
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                      ,0x24,
                      "int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      local_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      local_48 = (void *)0x0;
    }
    FSoundID::FSoundID(&local_4c,"loremaster/active");
    S_Sound(pAVar1,4,&local_4c,1.0,1.0);
    FName::FName(&local_50,"LoreShot2");
    AActor::Pos(&local_68,stateowner);
    Spawn(&local_50,&local_68,ALLOW_REPLACE);
    FName::FName(&local_6c,"LoreShot2");
    pAVar1 = stateowner;
    TVector3<double>::operator-(&local_b8,&stateowner->Vel);
    TVector3<double>::operator/(&local_a0,&local_b8,2.0);
    AActor::Vec3Offset(&local_88,pAVar1,&local_a0,false);
    Spawn(&local_6c,&local_88,ALLOW_REPLACE);
    FName::FName(&local_bc,"LoreShot2");
    pAVar1 = stateowner;
    TVector3<double>::operator-(&local_f0,&stateowner->Vel);
    AActor::Vec3Offset(&local_d8,pAVar1,&local_f0,false);
    Spawn(&local_bc,&local_d8,ALLOW_REPLACE);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                ,0x24,"int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LoremasterChain)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_BODY, "loremaster/active", 1, ATTN_NORM);
	Spawn("LoreShot2", self->Pos(), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel/2.), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel), ALLOW_REPLACE);
	return 0;
}